

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_feature_advanced.c
# Opt level: O2

int main(int argc,char **args)

{
  int iVar1;
  uint uVar2;
  FILE *__s;
  FILE *__stream;
  FILE *pFVar3;
  char *pcVar4;
  size_t sVar5;
  extractor_fn p_Var6;
  void *__s_00;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  void *pvVar10;
  light_pcapng pcapng;
  light_option p_Var11;
  uint32_t *puVar12;
  uint64_t uVar13;
  long lVar14;
  undefined8 uVar15;
  char *__ptr;
  ulong uVar16;
  long lVar17;
  long lVar18;
  extractor_fn *pp_Var19;
  char **ppcVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 local_240;
  uint64_t feature_values [64];
  
  __s = fopen("features/unscaled.csv","w");
  __stream = fopen("features/raw.dat","w");
  iVar1 = system("make -C features");
  if (iVar1 == 0) {
    feature_lib_handle = (void *)dlopen("./features/libfeatures.so",1);
    pFVar3 = _stderr;
    if (feature_lib_handle == (void *)0x0) {
      uVar15 = dlerror();
      fprintf(pFVar3,"dlerror: %s\n",uVar15);
    }
    else {
      pFVar3 = fopen("features/feature_list.txt","r");
      if (pFVar3 != (FILE *)0x0) {
        ppcVar20 = feature_names;
        while( true ) {
          memset(feature_values,0,0x100);
          pcVar4 = fgets((char *)feature_values,0x100,pFVar3);
          if (pcVar4 == (char *)0x0) break;
          sVar5 = strlen((char *)feature_values);
          if (*(char *)((sVar5 - 1) + (long)feature_values) == '\n') {
            *(undefined1 *)((long)feature_values + (sVar5 - 1)) = 0;
          }
          p_Var6 = (extractor_fn)dlsym(feature_lib_handle);
          iVar1 = feature_count;
          if (p_Var6 == (extractor_fn)0x0) {
            fprintf(_stderr,"Unable to find symbol %s\n",feature_values);
          }
          else {
            lVar18 = (long)feature_count;
            features[lVar18] = p_Var6;
            pcVar4 = strdup((char *)feature_values);
            feature_names[lVar18] = pcVar4;
            feature_count = iVar1 + 1;
          }
        }
        fclose(pFVar3);
        sVar5 = (size_t)feature_count;
        __s_00 = calloc(sVar5,8);
        memset(__s_00,0xff,sVar5 * 8);
        pvVar7 = calloc(sVar5,8);
        uVar2 = argc - 1;
        pvVar8 = calloc((long)(int)uVar2,8);
        uVar16 = 0;
        uVar9 = 0;
        if (0 < (int)uVar2) {
          uVar9 = (ulong)uVar2;
        }
        for (; uVar9 != uVar16; uVar16 = uVar16 + 1) {
          pvVar10 = calloc(sVar5,8);
          *(void **)((long)pvVar8 + uVar16 * 8) = pvVar10;
        }
        fwrite("address1, address2",0x12,1,__s);
        for (lVar18 = 0; lVar18 < feature_count; lVar18 = lVar18 + 1) {
          fprintf(__s,", %s",*ppcVar20);
          ppcVar20 = ppcVar20 + 1;
        }
        fputc(10,__s);
        printf("Running feature extraction with %d functions and %d traces\n",
               (ulong)(uint)feature_count,(ulong)uVar2);
        local_240 = (long)argc;
        lVar18 = 1;
        do {
          if (local_240 <= lVar18) {
            fclose(__s);
            puts("Start exporting double features!");
            fprintf(__stream,"%% %d features\n",(ulong)(uint)feature_count);
            fprintf(__stream,"%% %d items\n",(ulong)uVar2);
            for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
              for (lVar18 = 0; lVar18 < feature_count; lVar18 = lVar18 + 1) {
                lVar17 = *(long *)(*(long *)((long)pvVar8 + uVar16 * 8) + lVar18 * 8);
                if (lVar17 == -1) {
                  dVar21 = 0.0;
                }
                else {
                  lVar14 = *(long *)((long)__s_00 + lVar18 * 8);
                  lVar17 = lVar17 - lVar14;
                  auVar22._8_4_ = (int)((ulong)lVar17 >> 0x20);
                  auVar22._0_8_ = lVar17;
                  auVar22._12_4_ = 0x45300000;
                  lVar14 = *(long *)((long)pvVar7 + lVar18 * 8) - lVar14;
                  auVar23._8_4_ = (int)((ulong)lVar14 >> 0x20);
                  auVar23._0_8_ = lVar14;
                  auVar23._12_4_ = 0x45300000;
                  dVar21 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) /
                           ((auVar23._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0));
                }
                fprintf(__stream,"%.6lf ",dVar21);
              }
              fputc(10,__stream);
            }
            fclose(__stream);
            uVar16 = 0;
            uVar9 = (ulong)(uint)feature_count;
            if (feature_count < 1) {
              uVar9 = uVar16;
            }
            for (; uVar9 * 8 != uVar16; uVar16 = uVar16 + 8) {
              free(*(void **)((long)feature_names + uVar16));
            }
            dlclose(feature_lib_handle);
            feature_lib_handle = (void *)0x0;
            return 0;
          }
          pcVar4 = args[lVar18];
          pcapng = light_read_from_path(pcVar4);
          if (pcapng == (light_pcapng)0x0) {
            fprintf(_stderr,"Unable to read pcapng: %s\n",pcVar4);
          }
          else {
            p_Var11 = light_get_option(pcapng,0xadd4);
            if (p_Var11 == (light_option)0x0) {
LAB_001025e7:
              __ptr = "unknown, unknown";
              sVar5 = 0x10;
LAB_001025fb:
              fwrite(__ptr,sVar5,1,__s);
            }
            else {
              puVar12 = light_get_option_data(p_Var11);
              if ((char)*puVar12 == '\x06') {
                __ptr = "ipv6, ipv6";
                sVar5 = 10;
                goto LAB_001025fb;
              }
              if ((char)*puVar12 != '\x04') goto LAB_001025e7;
              fprintf(__s,"%u.%u.%u.%u, %u.%u.%u.%u",(ulong)*(byte *)((long)puVar12 + 1),
                      (ulong)*(byte *)((long)puVar12 + 2),(ulong)*(byte *)((long)puVar12 + 3),
                      (ulong)(byte)puVar12[1],(ulong)*(byte *)((long)puVar12 + 5),
                      (ulong)*(byte *)((long)puVar12 + 6),(ulong)*(byte *)((long)puVar12 + 7),
                      (ulong)(byte)puVar12[2]);
            }
            printf("Extract features for %s\n",pcVar4);
            pp_Var19 = features;
            for (lVar17 = 0; lVar17 < feature_count; lVar17 = lVar17 + 1) {
              uVar13 = (**pp_Var19)(pcapng);
              feature_values[lVar17] = uVar13;
              fprintf(__s,", %lu",uVar13);
              uVar16 = feature_values[lVar17];
              *(ulong *)(*(long *)((long)pvVar8 + lVar18 * 8 + -8) + lVar17 * 8) = uVar16;
              if (uVar16 != 0xffffffffffffffff) {
                if (uVar16 < *(ulong *)((long)__s_00 + lVar17 * 8)) {
                  *(ulong *)((long)__s_00 + lVar17 * 8) = uVar16;
                }
                if (*(ulong *)((long)pvVar7 + lVar17 * 8) < uVar16) {
                  *(ulong *)((long)pvVar7 + lVar17 * 8) = uVar16;
                }
              }
              pp_Var19 = pp_Var19 + 1;
            }
            fputc(10,__s);
            p_Var11 = light_create_option(100,(uint16_t)(feature_count << 3),feature_values);
            light_update_option(pcapng,pcapng,p_Var11);
            light_pcapng_to_file(pcVar4,pcapng);
            light_free_option(p_Var11);
            light_pcapng_release(pcapng);
          }
          lVar18 = lVar18 + 1;
        } while( true );
      }
      perror("Unable to open feature_list.txt");
    }
    fwrite("Unable to extract function pointers!\n",0x25,1,_stderr);
  }
  else {
    fwrite("Unable to compile features!\n",0x1c,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, const char **args) {
	int i, j;
	FILE *features_csv = fopen("features/unscaled.csv", "w");
	FILE *features_raw = fopen("features/raw.dat", "w");
	uint64_t *min_features = NULL;
	uint64_t *max_features = NULL;
	uint64_t **feature_table = NULL;

	if (compile_features() != 0) {
		fprintf(stderr, "Unable to compile features!\n");
		return EXIT_FAILURE;
	}

	if (extract_features() != 0) {
		fprintf(stderr, "Unable to extract function pointers!\n");
		return EXIT_FAILURE;
	}

	min_features = calloc(feature_count, sizeof(uint64_t));
	memset(min_features, -1, feature_count * sizeof(uint64_t));

	max_features = calloc(feature_count, sizeof(uint64_t));
	feature_table = calloc(argc - 1, sizeof(uint64_t *));
	for (i = 0; i < argc - 1; ++i) {
		feature_table[i] = calloc(feature_count, sizeof(uint64_t));
	}

	fprintf(features_csv, "address1, address2");
	for (i = 0; i < feature_count; ++i) {
		fprintf(features_csv, ", %s", feature_names[i]);
	}
	fprintf(features_csv, "\n");

	printf("Running feature extraction with %d functions and %d traces\n", feature_count, argc - 1);

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			uint64_t feature_values[MAX_FEATURES];
			light_option feature_option;
			light_option address_option;

			address_option = light_get_option(pcapng, LIGHT_CUSTOM_OPTION_ADDRESS_INFO);
			if (address_option != NULL) {
				uint8_t *label = (uint8_t *)light_get_option_data(address_option);
				if (*label == 4) {
					uint8_t source[4], destination[4];
					memcpy(source, label + 1, sizeof(uint32_t));
					memcpy(destination, label + 5, sizeof(uint32_t));
					fprintf(features_csv, "%u.%u.%u.%u, %u.%u.%u.%u",
							source[0], source[1], source[2], source[3],
							destination[0], destination[1], destination[2], destination[3]);
				}
				else if (*label == 6) {
					fprintf(features_csv, "ipv6, ipv6");
				}
				else {
					fprintf(features_csv, "unknown, unknown");
				}
			}
			else {
				fprintf(features_csv, "unknown, unknown");
			}

			printf("Extract features for %s\n", file);

			// Write output to file.
			for (j = 0; j < feature_count; ++j) {
				feature_values[j] = features[j](pcapng);
				fprintf(features_csv, ", %lu", feature_values[j]);

				// Save for later.
				feature_table[i - 1][j] = feature_values[j];

				if (feature_values[j] == -1) {
					// Invalid value.
					continue;
				}

				if (min_features[j] > feature_table[i - 1][j]) {
					min_features[j] = feature_table[i - 1][j];
				}
				if (max_features[j] < feature_table[i - 1][j]) {
					max_features[j] = feature_table[i - 1][j];
				}
			}
			fprintf(features_csv, "\n");

			// Update .pcapng traces with computed metrics.
			feature_option = light_create_option(LIGHT_CUSTOM_OPTION_FEATURE_U64, feature_count * sizeof(uint64_t), feature_values);
			light_update_option(pcapng, pcapng, feature_option);
			light_pcapng_to_file(file, pcapng);

			light_free_option(feature_option);
			light_pcapng_release(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	fclose(features_csv);

	//////////////////////////////////////////////////////////////////////////////////////////////////////
	printf("Start exporting double features!\n");

	fprintf(features_raw, "%% %d features\n", feature_count);
	fprintf(features_raw, "%% %d items\n", argc - 1);

	for (i = 0; i < argc - 1; ++i) {
		for (j = 0; j < feature_count; ++j) {
			if (feature_table[i][j] == -1) {
				// Invalid feature.
				fprintf(features_raw, "%.6lf ", 0.0);
			}
			else {
				double f = (double)(feature_table[i][j] - min_features[j]) / (max_features[j] - min_features[j]);
				fprintf(features_raw, "%.6lf ", f);
			}
		}
		fprintf(features_raw, "\n");
	}
	fclose(features_raw);

	cleanup();

	return EXIT_SUCCESS;
}